

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O3

void __thiscall AnalyzerDecl::~AnalyzerDecl(AnalyzerDecl *this)

{
  Function *this_00;
  Param *this_01;
  StateVarList *pSVar1;
  AnalyzerActionList *pAVar2;
  AnalyzerHelperList *pAVar3;
  pointer ppFVar4;
  pointer ppPVar5;
  pointer ppSVar6;
  pointer ppAVar7;
  FunctionList *pFVar8;
  ParamList *pPVar9;
  pointer ppAVar10;
  
  (this->super_TypeDecl).super_Decl._vptr_Decl = (_func_int **)&PTR__AnalyzerDecl_00143e20;
  pSVar1 = this->statevars_;
  if (pSVar1 == (StateVarList *)0x0) {
    pSVar1 = (StateVarList *)0x0;
  }
  else {
    ppSVar6 = (pSVar1->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar6 !=
        (pSVar1->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        operator_delete(*ppSVar6,0x10);
        ppSVar6 = ppSVar6 + 1;
        pSVar1 = this->statevars_;
      } while (ppSVar6 !=
               (pSVar1->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      ppSVar6 = (pSVar1->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (ppSVar6 != (pointer)0x0) {
      operator_delete(ppSVar6,(long)(pSVar1->
                                    super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppSVar6);
    }
  }
  operator_delete(pSVar1,0x18);
  this->statevars_ = (StateVarList *)0x0;
  pAVar2 = this->actions_;
  if (pAVar2 == (AnalyzerActionList *)0x0) {
    pAVar2 = (AnalyzerActionList *)0x0;
  }
  else {
    ppAVar7 = (pAVar2->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar7 !=
        (pAVar2->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar7 != (AnalyzerAction *)0x0) {
          (*((*ppAVar7)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
          pAVar2 = this->actions_;
        }
        ppAVar7 = ppAVar7 + 1;
      } while (ppAVar7 !=
               (pAVar2->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      ppAVar7 = (pAVar2->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    if (ppAVar7 != (pointer)0x0) {
      operator_delete(ppAVar7,(long)(pAVar2->
                                    super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar7);
    }
  }
  operator_delete(pAVar2,0x18);
  this->actions_ = (AnalyzerActionList *)0x0;
  pAVar3 = this->helpers_;
  if (pAVar3 == (AnalyzerHelperList *)0x0) {
    pAVar3 = (AnalyzerHelperList *)0x0;
  }
  else {
    ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar10 !=
        (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar10 != (AnalyzerHelper *)0x0) {
          (*((*ppAVar10)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
          pAVar3 = this->helpers_;
        }
        ppAVar10 = ppAVar10 + 1;
      } while (ppAVar10 !=
               (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    }
    if (ppAVar10 != (pointer)0x0) {
      operator_delete(ppAVar10,(long)(pAVar3->
                                     super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppAVar10);
    }
  }
  operator_delete(pAVar3,0x18);
  this->helpers_ = (AnalyzerHelperList *)0x0;
  pFVar8 = this->functions_;
  if (pFVar8 == (FunctionList *)0x0) {
    pFVar8 = (FunctionList *)0x0;
  }
  else {
    ppFVar4 = (pFVar8->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppFVar4 !=
        (pFVar8->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        this_00 = *ppFVar4;
        if (this_00 != (Function *)0x0) {
          Function::~Function(this_00);
        }
        operator_delete(this_00,0x80);
        ppFVar4 = ppFVar4 + 1;
        pFVar8 = this->functions_;
      } while (ppFVar4 !=
               (pFVar8->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      ppFVar4 = (pFVar8->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (ppFVar4 != (pointer)0x0) {
      operator_delete(ppFVar4,(long)(pFVar8->
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppFVar4);
    }
  }
  operator_delete(pFVar8,0x18);
  this->functions_ = (FunctionList *)0x0;
  pPVar9 = (this->super_TypeDecl).params_;
  if (pPVar9 == (ParamList *)0x0) {
    pPVar9 = (ParamList *)0x0;
  }
  else {
    ppPVar5 = (pPVar9->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppPVar5 !=
        (pPVar9->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        this_01 = *ppPVar5;
        if (this_01 != (Param *)0x0) {
          Param::~Param(this_01);
        }
        operator_delete(this_01,0x80);
        ppPVar5 = ppPVar5 + 1;
        pPVar9 = (this->super_TypeDecl).params_;
      } while (ppPVar5 !=
               (pPVar9->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      ppPVar5 = (pPVar9->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (ppPVar5 != (pointer)0x0) {
      operator_delete(ppPVar5,(long)(pPVar9->super__Vector_base<Param_*,_std::allocator<Param_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppPVar5);
    }
  }
  operator_delete(pPVar9,0x18);
  (this->super_TypeDecl).params_ = (ParamList *)0x0;
  pAVar3 = this->constructor_helpers_;
  if (pAVar3 == (AnalyzerHelperList *)0x0) {
    pAVar3 = (AnalyzerHelperList *)0x0;
  }
  else {
    ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar10 !=
        (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar10 != (AnalyzerHelper *)0x0) {
          (*((*ppAVar10)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
          pAVar3 = this->constructor_helpers_;
        }
        ppAVar10 = ppAVar10 + 1;
      } while (ppAVar10 !=
               (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    }
    if (ppAVar10 != (pointer)0x0) {
      operator_delete(ppAVar10,(long)(pAVar3->
                                     super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppAVar10);
    }
  }
  operator_delete(pAVar3,0x18);
  this->constructor_helpers_ = (AnalyzerHelperList *)0x0;
  pAVar3 = this->destructor_helpers_;
  if (pAVar3 == (AnalyzerHelperList *)0x0) {
    pAVar3 = (AnalyzerHelperList *)0x0;
  }
  else {
    ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar10 !=
        (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar10 != (AnalyzerHelper *)0x0) {
          (*((*ppAVar10)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
          pAVar3 = this->destructor_helpers_;
        }
        ppAVar10 = ppAVar10 + 1;
      } while (ppAVar10 !=
               (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    }
    if (ppAVar10 != (pointer)0x0) {
      operator_delete(ppAVar10,(long)(pAVar3->
                                     super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppAVar10);
    }
  }
  operator_delete(pAVar3,0x18);
  this->destructor_helpers_ = (AnalyzerHelperList *)0x0;
  pAVar3 = this->eof_helpers_;
  if (pAVar3 == (AnalyzerHelperList *)0x0) {
    pAVar3 = (AnalyzerHelperList *)0x0;
  }
  else {
    ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar10 !=
        (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar10 != (AnalyzerHelper *)0x0) {
          (*((*ppAVar10)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
          pAVar3 = this->eof_helpers_;
        }
        ppAVar10 = ppAVar10 + 1;
      } while (ppAVar10 !=
               (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      ppAVar10 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    }
    if (ppAVar10 != (pointer)0x0) {
      operator_delete(ppAVar10,(long)(pAVar3->
                                     super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppAVar10);
    }
  }
  operator_delete(pAVar3,0x18);
  this->eof_helpers_ = (AnalyzerHelperList *)0x0;
  TypeDecl::~TypeDecl(&this->super_TypeDecl);
  return;
}

Assistant:

AnalyzerDecl::~AnalyzerDecl()
	{
	delete_list(StateVarList, statevars_);
	delete_list(AnalyzerActionList, actions_);
	delete_list(AnalyzerHelperList, helpers_);
	delete_list(FunctionList, functions_);
	delete_list(ParamList, params_);
	delete_list(AnalyzerHelperList, constructor_helpers_);
	delete_list(AnalyzerHelperList, destructor_helpers_);
	delete_list(AnalyzerHelperList, eof_helpers_);
	}